

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void spr_write_spefscr(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  tcg_gen_extrl_i64_i32_ppc64(s,(TCGv_i32)((long)ts - (long)s),cpu_gpr[gprn]);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0x12f38);
  tcg_temp_free_internal_ppc64(s,ts);
  return;
}

Assistant:

static void spr_write_spefscr(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, t0, cpu_gpr[gprn]);
    tcg_gen_st_i32(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, spe_fscr));
    tcg_temp_free_i32(tcg_ctx, t0);
}